

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::LoadMD5MeshFile(MD5Importer *this)

{
  pointer *this_00;
  IOSystem *this_01;
  long lVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  int iVar19;
  IOStream *__p;
  pointer pIVar20;
  undefined4 extraout_var;
  Logger *pLVar21;
  aiNode *paVar22;
  aiNode **ppaVar23;
  reference pMVar24;
  aiMesh **ppaVar25;
  aiMaterial **ppaVar26;
  pointer pVVar27;
  reference meshSrc_00;
  aiMesh *this_02;
  char *pcVar28;
  size_type sVar29;
  aiVector3t<float> *paVar30;
  ulong uVar31;
  VertexDesc *__s;
  void *pvVar32;
  aiBone *this_03;
  aiVertexWeight *paVar33;
  reference pvVar34;
  reference pVVar35;
  reference pvVar36;
  DeadlyImportError *this_04;
  ulong *puVar37;
  reference pvVar38;
  aiMaterial *this_05;
  aiFace *paVar39;
  float fVar40;
  float fVar41;
  aiVector3t<float> aVar42;
  aiFace *local_1928;
  aiVertexWeight *local_1848;
  aiVector3t<float> *local_17d8;
  aiVector3t<float> *local_17b0;
  aiString local_1710;
  aiString local_130c;
  aiString local_f08;
  undefined1 local_b04 [8];
  aiString temp;
  aiMaterial *mat;
  uint c;
  uint p_2;
  long local_6e8;
  aiBone *bone;
  float local_6d8;
  aiVector3t<float> local_6d0;
  aiVector3t<float> local_6c0;
  aiBone *local_6b0;
  float local_6a8;
  aiVector3t<float> local_6a0;
  undefined1 local_690 [8];
  aiVector3D v;
  BoneDesc *boneSrc_1;
  ai_real fNewWeight;
  WeightDesc *weightDesc_1;
  string local_660;
  uint local_640;
  uint local_63c;
  uint w_2;
  uint jub_2;
  uint w_1;
  uint jub_1;
  ai_real fSum;
  float local_624;
  __normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_620;
  __normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_618;
  __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_610;
  const_iterator iter_2;
  BoneDesc *boneSrc;
  aiBone *local_1f8;
  aiBone *p_1;
  uint local_1e8;
  uint h;
  uint q;
  uint p;
  WeightDesc *weightDesc;
  uint w;
  uint jub;
  __normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_1c8;
  __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_1c0;
  const_iterator iter_1;
  uint *piCount;
  __normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_1a8;
  __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
  local_1a0;
  const_iterator iter;
  aiVector3D *pv;
  undefined1 local_188 [8];
  string name;
  aiMesh *mesh;
  MeshDesc *meshSrc;
  iterator end_1;
  iterator it_1;
  uint n;
  uint m;
  __normal_iterator<const_Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
  local_138;
  const_iterator end;
  __normal_iterator<const_Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
  local_128;
  const_iterator it;
  aiNode *pcNode;
  string local_110;
  undefined1 local_f0 [8];
  MD5MeshParser meshParser;
  MD5Parser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_59;
  string local_58;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_38;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  string pFile;
  MD5Importer *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &this->mFile,"md5mesh");
  this_01 = this->pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"rb",&local_59);
  __p = IOSystem::Open(this_01,(string *)&file,&local_58);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_38,__p);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pIVar20 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                      (&local_38);
  if (pIVar20 != (pointer)0x0) {
    pIVar20 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                        (&local_38);
    iVar19 = (*pIVar20->_vptr_IOStream[6])();
    if (CONCAT44(extraout_var,iVar19) != 0) {
      this->bHadMD5Mesh = true;
      pIVar20 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                          (&local_38);
      LoadFileIntoMemory(this,pIVar20);
      MD5::MD5Parser::MD5Parser
                ((MD5Parser *)
                 &meshParser.mJoints.
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,this->mBuffer,this->fileSize);
      MD5::MD5MeshParser::MD5MeshParser
                ((MD5MeshParser *)local_f0,
                 (SectionList *)
                 &meshParser.mJoints.
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      paVar22 = (aiNode *)operator_new(0x478);
      pcNode._6_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_110,"<MD5_Root>",(allocator *)((long)&pcNode + 7));
      aiNode::aiNode(paVar22,&local_110);
      pcNode._6_1_ = 0;
      this->pScene->mRootNode = paVar22;
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pcNode + 7));
      this->pScene->mRootNode->mNumChildren = 2;
      ppaVar23 = (aiNode **)operator_new__(0x10);
      this->pScene->mRootNode->mChildren = ppaVar23;
      paVar22 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar22);
      this->pScene->mRootNode->mChildren[1] = paVar22;
      it._M_current = (MeshDesc *)paVar22;
      aiString::Set((aiString *)paVar22,"<MD5_Hierarchy>");
      *(aiNode **)(((it._M_current)->mShader).data + 0x3fc) = this->pScene->mRootNode;
      AttachChilds_Mesh(this,-1,(aiNode *)it._M_current,
                        (BoneList *)
                        &meshParser.mMeshes.
                         super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      paVar22 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar22);
      *this->pScene->mRootNode->mChildren = paVar22;
      it._M_current = (MeshDesc *)paVar22;
      aiString::Set((aiString *)paVar22,"<MD5_Mesh>");
      *(aiNode **)(((it._M_current)->mShader).data + 0x3fc) = this->pScene->mRootNode;
      end._M_current =
           (MeshDesc *)
           std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::begin
                     ((vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_> *)
                      local_f0);
      __gnu_cxx::
      __normal_iterator<Assimp::MD5::MeshDesc_const*,std::vector<Assimp::MD5::MeshDesc,std::allocator<Assimp::MD5::MeshDesc>>>
      ::__normal_iterator<Assimp::MD5::MeshDesc*>
                ((__normal_iterator<Assimp::MD5::MeshDesc_const*,std::vector<Assimp::MD5::MeshDesc,std::allocator<Assimp::MD5::MeshDesc>>>
                  *)&local_128,
                 (__normal_iterator<Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                  *)&end);
      _n = std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::end
                     ((vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_> *)
                      local_f0);
      __gnu_cxx::
      __normal_iterator<Assimp::MD5::MeshDesc_const*,std::vector<Assimp::MD5::MeshDesc,std::allocator<Assimp::MD5::MeshDesc>>>
      ::__normal_iterator<Assimp::MD5::MeshDesc*>
                ((__normal_iterator<Assimp::MD5::MeshDesc_const*,std::vector<Assimp::MD5::MeshDesc,std::allocator<Assimp::MD5::MeshDesc>>>
                  *)&local_138,
                 (__normal_iterator<Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                  *)&n);
      while (bVar18 = __gnu_cxx::operator!=(&local_128,&local_138), bVar18) {
        pMVar24 = __gnu_cxx::
                  __normal_iterator<const_Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                  ::operator*(&local_128);
        bVar18 = std::vector<aiFace,_std::allocator<aiFace>_>::empty(&pMVar24->mFaces);
        if (!bVar18) {
          pMVar24 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                    ::operator*(&local_128);
          bVar18 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                   empty(&pMVar24->mVertices);
          if (!bVar18) {
            this->pScene->mNumMaterials = this->pScene->mNumMaterials + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
        ::operator++(&local_128);
      }
      this->pScene->mNumMeshes = this->pScene->mNumMaterials;
      ppaVar25 = (aiMesh **)operator_new__((ulong)this->pScene->mNumMeshes << 3);
      this->pScene->mMeshes = ppaVar25;
      ppaVar26 = (aiMaterial **)operator_new__((ulong)this->pScene->mNumMeshes << 3);
      this->pScene->mMaterials = ppaVar26;
      *(uint *)&it._M_current[1].mWeights.
                super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = this->pScene->mNumMeshes;
      pVVar27 = (pointer)operator_new__((ulong)*(uint *)&it._M_current[1].mWeights.
                                                                                                                  
                                                  super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        << 2);
      it._M_current[1].mVertices.
      super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar27;
      for (it_1._M_current._4_4_ = 0.0;
          (uint)it_1._M_current._4_4_ <
          (uint)*(float *)&it._M_current[1].mWeights.
                           super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
          it_1._M_current._4_4_ = (float)((int)it_1._M_current._4_4_ + 1)) {
        (&((it._M_current[1].mVertices.
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start)->mUV).x)[(uint)it_1._M_current._4_4_] =
             it_1._M_current._4_4_;
      }
      it_1._M_current._0_4_ = 0;
      end_1 = std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::begin
                        ((vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_> *)
                         local_f0);
      meshSrc = (MeshDesc *)
                std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::end
                          ((vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_> *)
                           local_f0);
      while (bVar18 = __gnu_cxx::operator!=
                                (&end_1,(__normal_iterator<Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                                         *)&meshSrc), bVar18) {
        meshSrc_00 = __gnu_cxx::
                     __normal_iterator<Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
                     ::operator*(&end_1);
        bVar18 = std::vector<aiFace,_std::allocator<aiFace>_>::empty(&meshSrc_00->mFaces);
        if ((!bVar18) &&
           (bVar18 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                     ::empty(&meshSrc_00->mVertices), !bVar18)) {
          this_02 = (aiMesh *)operator_new(0x520);
          aiMesh::aiMesh(this_02);
          this->pScene->mMeshes[(uint)it_1._M_current] = this_02;
          this_02->mPrimitiveTypes = 4;
          name.field_2._8_8_ = this_02;
          MakeDataUnique(this,meshSrc_00);
          pcVar28 = aiString::C_Str(&meshSrc_00->mShader);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_188,pcVar28,(allocator *)((long)&pv + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&pv + 7));
          std::__cxx11::string::operator+=((string *)local_188,".msh");
          aiString::operator=((aiString *)(name.field_2._8_8_ + 0xec),(string *)local_188);
          sVar29 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                   size(&meshSrc_00->mVertices);
          *(int *)(name.field_2._8_8_ + 4) = (int)sVar29;
          uVar31 = (ulong)*(uint *)(name.field_2._8_8_ + 4);
          paVar30 = (aiVector3t<float> *)operator_new__(uVar31 * 0xc);
          if (uVar31 != 0) {
            local_17b0 = paVar30;
            do {
              aiVector3t<float>::aiVector3t(local_17b0);
              local_17b0 = local_17b0 + 1;
            } while (local_17b0 != paVar30 + uVar31);
          }
          *(aiVector3t<float> **)(name.field_2._8_8_ + 0x10) = paVar30;
          uVar31 = (ulong)*(uint *)(name.field_2._8_8_ + 4);
          paVar30 = (aiVector3t<float> *)operator_new__(uVar31 * 0xc);
          if (uVar31 != 0) {
            local_17d8 = paVar30;
            do {
              aiVector3t<float>::aiVector3t(local_17d8);
              local_17d8 = local_17d8 + 1;
            } while (local_17d8 != paVar30 + uVar31);
          }
          *(aiVector3t<float> **)(name.field_2._8_8_ + 0x70) = paVar30;
          *(undefined4 *)(name.field_2._8_8_ + 0xb0) = 2;
          iter._M_current = *(VertexDesc **)(name.field_2._8_8_ + 0x70);
          local_1a8._M_current =
               (VertexDesc *)
               std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::begin
                         (&meshSrc_00->mVertices);
          __gnu_cxx::
          __normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
          ::__normal_iterator<Assimp::MD5::VertexDesc*>
                    ((__normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
                      *)&local_1a0,&local_1a8);
          while( true ) {
            piCount = (uint *)std::
                              vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                              ::end(&meshSrc_00->mVertices);
            bVar18 = __gnu_cxx::operator!=
                               (&local_1a0,
                                (__normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                                 *)&piCount);
            if (!bVar18) break;
            pVVar35 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                      ::operator*(&local_1a0);
            ((iter._M_current)->mUV).x = (pVVar35->mUV).x;
            pVVar35 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                      ::operator*(&local_1a0);
            ((iter._M_current)->mUV).y = 1.0 - (pVVar35->mUV).y;
            (iter._M_current)->mFirstWeight = 0;
            __gnu_cxx::
            __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
            ::operator++(&local_1a0);
            iter._M_current = (VertexDesc *)&(iter._M_current)->mNumWeights;
          }
          sVar29 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::size
                             ((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                               *)&meshParser.mMeshes.
                                  super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sVar29;
          uVar31 = SUB168(auVar2 * ZEXT816(4),0);
          if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
            uVar31 = 0xffffffffffffffff;
          }
          __s = (VertexDesc *)operator_new__(uVar31);
          iter_1._M_current = __s;
          sVar29 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::size
                             ((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                               *)&meshParser.mMeshes.
                                  super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          memset(__s,0,sVar29 << 2);
          local_1c8._M_current =
               (VertexDesc *)
               std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::begin
                         (&meshSrc_00->mVertices);
          __gnu_cxx::
          __normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
          ::__normal_iterator<Assimp::MD5::VertexDesc*>
                    ((__normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
                      *)&local_1c0,&local_1c8);
          while( true ) {
            _w = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::end
                           (&meshSrc_00->mVertices);
            bVar18 = __gnu_cxx::operator!=
                               (&local_1c0,
                                (__normal_iterator<Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                                 *)&w);
            if (!bVar18) break;
            pVVar35 = __gnu_cxx::
                      __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                      ::operator*(&local_1c0);
            weightDesc._0_4_ = pVVar35->mFirstWeight;
            weightDesc._4_4_ = (uint)weightDesc;
            for (; uVar17 = weightDesc._4_4_, uVar16 = (uint)weightDesc,
                pVVar35 = __gnu_cxx::
                          __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                          ::operator*(&local_1c0), uVar16 < uVar17 + pVVar35->mNumWeights;
                weightDesc._0_4_ = (uint)weightDesc + 1) {
              _q = std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::
                   operator[](&meshSrc_00->mWeights,(ulong)(uint)weightDesc);
              fVar41 = _q->mWeight;
              fVar40 = Math::getEpsilon<float>();
              if ((fVar40 <= fVar41) ||
                 (fVar41 = _q->mWeight, fVar40 = Math::getEpsilon<float>(), fVar41 < -fVar40)) {
                (&((iter_1._M_current)->mUV).x)[_q->mBone] =
                     (float)((int)(&((iter_1._M_current)->mUV).x)[_q->mBone] + 1);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
            ::operator++(&local_1c0);
            iter._M_current = (VertexDesc *)&(iter._M_current)->mNumWeights;
          }
          for (h = 0; uVar31 = (ulong)h,
              sVar29 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                       size((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_> *
                            )&meshParser.mMeshes.
                              super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar31 < sVar29;
              h = h + 1) {
            if ((&((iter_1._M_current)->mUV).x)[h] != 0.0) {
              *(int *)(name.field_2._8_8_ + 0xd8) = *(int *)(name.field_2._8_8_ + 0xd8) + 1;
            }
          }
          if (*(int *)(name.field_2._8_8_ + 0xd8) != 0) {
            pvVar32 = operator_new__((ulong)*(uint *)(name.field_2._8_8_ + 0xd8) << 3);
            *(void **)(name.field_2._8_8_ + 0xe0) = pvVar32;
            p_1._4_4_ = 0;
            for (local_1e8 = 0; uVar31 = (ulong)local_1e8,
                sVar29 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ::size((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 *)&meshParser.mMeshes.
                                    super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage),
                uVar31 < sVar29; local_1e8 = local_1e8 + 1) {
              if ((&((iter_1._M_current)->mUV).x)[local_1e8] != 0.0) {
                this_03 = (aiBone *)operator_new(0x450);
                aiBone::aiBone(this_03);
                *(aiBone **)(*(long *)(name.field_2._8_8_ + 0xe0) + (ulong)p_1._4_4_ * 8) = this_03;
                this_03->mNumWeights = (uint)(&((iter_1._M_current)->mUV).x)[local_1e8];
                uVar31 = (ulong)this_03->mNumWeights;
                local_1f8 = this_03;
                paVar33 = (aiVertexWeight *)operator_new__(uVar31 << 3);
                if (uVar31 != 0) {
                  local_1848 = paVar33;
                  do {
                    aiVertexWeight::aiVertexWeight(local_1848);
                    local_1848 = local_1848 + 1;
                  } while (local_1848 != paVar33 + uVar31);
                }
                local_1f8->mWeights = paVar33;
                pvVar34 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ::operator[]((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                        *)&meshParser.mMeshes.
                                           super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)local_1e8);
                aiString::aiString((aiString *)((long)&boneSrc + 4),(aiString *)pvVar34);
                aiString::operator=(&local_1f8->mName,(aiString *)((long)&boneSrc + 4));
                this_00 = &meshParser.mMeshes.
                           super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pvVar34 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                          ::operator[]((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                        *)this_00,(ulong)local_1e8);
                fVar12 = (pvVar34->mInvTransform).a1;
                fVar13 = (pvVar34->mInvTransform).a2;
                fVar14 = (pvVar34->mInvTransform).a3;
                fVar15 = (pvVar34->mInvTransform).a4;
                fVar8 = (pvVar34->mInvTransform).b1;
                fVar9 = (pvVar34->mInvTransform).b2;
                fVar10 = (pvVar34->mInvTransform).b3;
                fVar11 = (pvVar34->mInvTransform).b4;
                fVar4 = (pvVar34->mInvTransform).c1;
                fVar5 = (pvVar34->mInvTransform).c2;
                fVar6 = (pvVar34->mInvTransform).c3;
                fVar7 = (pvVar34->mInvTransform).c4;
                fVar41 = (pvVar34->mInvTransform).d2;
                fVar40 = (pvVar34->mInvTransform).d3;
                fVar3 = (pvVar34->mInvTransform).d4;
                (local_1f8->mOffsetMatrix).d1 = (pvVar34->mInvTransform).d1;
                (local_1f8->mOffsetMatrix).d2 = fVar41;
                (local_1f8->mOffsetMatrix).d3 = fVar40;
                (local_1f8->mOffsetMatrix).d4 = fVar3;
                (local_1f8->mOffsetMatrix).c1 = fVar4;
                (local_1f8->mOffsetMatrix).c2 = fVar5;
                (local_1f8->mOffsetMatrix).c3 = fVar6;
                (local_1f8->mOffsetMatrix).c4 = fVar7;
                (local_1f8->mOffsetMatrix).b1 = fVar8;
                (local_1f8->mOffsetMatrix).b2 = fVar9;
                (local_1f8->mOffsetMatrix).b3 = fVar10;
                (local_1f8->mOffsetMatrix).b4 = fVar11;
                (local_1f8->mOffsetMatrix).a1 = fVar12;
                (local_1f8->mOffsetMatrix).a2 = fVar13;
                (local_1f8->mOffsetMatrix).a3 = fVar14;
                (local_1f8->mOffsetMatrix).a4 = fVar15;
                iter_2._M_current =
                     (VertexDesc *)
                     std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                     operator[]((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 *)this_00,(ulong)local_1e8);
                ((reference)iter_2._M_current)->mMap = p_1._4_4_;
                p_1._4_4_ = p_1._4_4_ + 1;
                MD5::ConvertQuaternion
                          (&((reference)iter_2._M_current)->mRotationQuat,
                           &((reference)iter_2._M_current)->mRotationQuatConverted);
              }
            }
            iter._M_current = *(VertexDesc **)(name.field_2._8_8_ + 0x10);
            local_618._M_current =
                 (VertexDesc *)
                 std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                 begin(&meshSrc_00->mVertices);
            __gnu_cxx::
            __normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
            ::__normal_iterator<Assimp::MD5::VertexDesc*>
                      ((__normal_iterator<Assimp::MD5::VertexDesc_const*,std::vector<Assimp::MD5::VertexDesc,std::allocator<Assimp::MD5::VertexDesc>>>
                        *)&local_610,&local_618);
            while( true ) {
              local_620._M_current =
                   (VertexDesc *)
                   std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                   end(&meshSrc_00->mVertices);
              bVar18 = __gnu_cxx::operator!=(&local_610,&local_620);
              if (!bVar18) break;
              aiVector3t<float>::aiVector3t((aiVector3t<float> *)&jub_1);
              (iter._M_current)->mUV = _jub_1;
              (iter._M_current)->mFirstWeight = (uint)local_624;
              w_1 = 0;
              pVVar35 = __gnu_cxx::
                        __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                        ::operator*(&local_610);
              w_2 = pVVar35->mFirstWeight;
              jub_2 = w_2;
              for (; uVar17 = jub_2, uVar16 = w_2,
                  pVVar35 = __gnu_cxx::
                            __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                            ::operator*(&local_610), uVar16 < uVar17 + pVVar35->mNumWeights;
                  w_2 = w_2 + 1) {
                pvVar36 = std::
                          vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                          ::operator[](&meshSrc_00->mWeights,(ulong)w_2);
                w_1 = (uint)(pvVar36->mWeight + (float)w_1);
              }
              if (((float)w_1 != 0.0) || (NAN((float)w_1))) {
                pVVar35 = __gnu_cxx::
                          __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                          ::operator*(&local_610);
                local_640 = pVVar35->mFirstWeight;
                local_63c = local_640;
                for (; uVar17 = local_63c, uVar16 = local_640,
                    pVVar35 = __gnu_cxx::
                              __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
                              ::operator*(&local_610), uVar16 < uVar17 + pVVar35->mNumWeights;
                    local_640 = local_640 + 1) {
                  uVar31 = (ulong)local_640;
                  sVar29 = std::
                           vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                           ::size(&meshSrc_00->mWeights);
                  if (sVar29 <= uVar31) {
                    weightDesc_1._6_1_ = 1;
                    this_04 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_660,"MD5MESH: Invalid weight index",
                               (allocator *)((long)&weightDesc_1 + 7));
                    DeadlyImportError::DeadlyImportError(this_04,&local_660);
                    weightDesc_1._6_1_ = 0;
                    __cxa_throw(this_04,&DeadlyImportError::typeinfo,
                                DeadlyImportError::~DeadlyImportError);
                  }
                  pvVar36 = std::
                            vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                            ::operator[](&meshSrc_00->mWeights,(ulong)local_640);
                  fVar41 = pvVar36->mWeight;
                  fVar40 = Math::getEpsilon<float>();
                  if ((fVar40 <= fVar41) ||
                     (fVar41 = pvVar36->mWeight, fVar40 = Math::getEpsilon<float>(),
                     fVar41 < -fVar40)) {
                    fVar41 = pvVar36->mWeight / (float)w_1;
                    register0x00000000 =
                         std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ::operator[]((vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                       *)&meshParser.mMeshes.
                                          super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (ulong)pvVar36->mBone);
                    aVar42 = aiQuaterniont<float>::Rotate
                                       (&register0x00000000->mRotationQuatConverted,
                                        &pvVar36->vOffsetPosition);
                    local_6a0.z = aVar42.z;
                    local_6a0._0_8_ = aVar42._0_8_;
                    local_690 = (undefined1  [8])local_6a0._0_8_;
                    v.x = local_6a0.z;
                    aVar42 = ::operator+(&stack0xfffffffffffff980->mPositionXYZ,
                                         (aiVector3t<float> *)local_690);
                    local_6d0.z = aVar42.z;
                    local_6d0._0_8_ = aVar42._0_8_;
                    local_6c0._0_8_ = local_6d0._0_8_;
                    local_6c0.z = local_6d0.z;
                    aVar42 = ::operator*(&local_6c0,pvVar36->mWeight);
                    local_6d8 = aVar42.z;
                    bone = aVar42._0_8_;
                    local_6b0 = bone;
                    local_6a8 = local_6d8;
                    aiVector3t<float>::operator+=
                              ((aiVector3t<float> *)iter._M_current,(aiVector3t<float> *)&local_6b0)
                    ;
                    local_6e8 = *(long *)(*(long *)(name.field_2._8_8_ + 0xe0) +
                                         (ulong)stack0xfffffffffffff980->mMap * 8);
                    aiVertexWeight::aiVertexWeight
                              ((aiVertexWeight *)&c,
                               (int)((ulong)((long)iter._M_current -
                                            *(long *)(name.field_2._8_8_ + 0x10)) >> 2) *
                               -0x55555555,fVar41);
                    paVar33 = *(aiVertexWeight **)(local_6e8 + 0x408);
                    *(aiVertexWeight **)(local_6e8 + 0x408) = paVar33 + 1;
                    *paVar33 = _c;
                  }
                }
              }
              else {
                pLVar21 = DefaultLogger::get();
                Logger::error(pLVar21,"MD5MESH: The sum of all vertex bone weights is 0");
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::VertexDesc_*,_std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>_>
              ::operator++(&local_610);
              iter._M_current = (VertexDesc *)&(iter._M_current)->mNumWeights;
            }
            for (mat._4_4_ = 0; mat._4_4_ < *(uint *)(name.field_2._8_8_ + 0xd8);
                mat._4_4_ = mat._4_4_ + 1) {
              lVar1 = *(long *)(*(long *)(name.field_2._8_8_ + 0xe0) + (ulong)mat._4_4_ * 8);
              *(ulong *)(lVar1 + 0x408) =
                   *(long *)(lVar1 + 0x408) +
                   (ulong)*(uint *)(*(long *)(*(long *)(name.field_2._8_8_ + 0xe0) +
                                             (ulong)mat._4_4_ * 8) + 0x404) * -8;
            }
          }
          if (iter_1._M_current != (VertexDesc *)0x0) {
            operator_delete__(iter_1._M_current);
          }
          sVar29 = std::vector<aiFace,_std::allocator<aiFace>_>::size(&meshSrc_00->mFaces);
          *(int *)(name.field_2._8_8_ + 8) = (int)sVar29;
          uVar31 = (ulong)*(uint *)(name.field_2._8_8_ + 8);
          puVar37 = (ulong *)operator_new__(uVar31 << 4 | 8);
          *puVar37 = uVar31;
          paVar39 = (aiFace *)(puVar37 + 1);
          if (uVar31 != 0) {
            local_1928 = paVar39;
            do {
              aiFace::aiFace(local_1928);
              local_1928 = local_1928 + 1;
            } while (local_1928 != paVar39 + uVar31);
          }
          *(aiFace **)(name.field_2._8_8_ + 0xd0) = paVar39;
          for (mat._0_4_ = 0; (uint)mat < *(uint *)(name.field_2._8_8_ + 8);
              mat._0_4_ = (uint)mat + 1) {
            *(undefined4 *)(*(long *)(name.field_2._8_8_ + 0xd0) + (ulong)(uint)mat * 0x10) = 3;
            pvVar38 = std::vector<aiFace,_std::allocator<aiFace>_>::operator[]
                                (&meshSrc_00->mFaces,(ulong)(uint)mat);
            *(uint **)(*(long *)(name.field_2._8_8_ + 0xd0) + (ulong)(uint)mat * 0x10 + 8) =
                 pvVar38->mIndices;
            pvVar38 = std::vector<aiFace,_std::allocator<aiFace>_>::operator[]
                                (&meshSrc_00->mFaces,(ulong)(uint)mat);
            pvVar38->mIndices = (uint *)0x0;
          }
          this_05 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_05);
          this->pScene->mMaterials[(uint)it_1._M_current] = this_05;
          temp.data._1016_8_ = this_05;
          if (((meshSrc_00->mShader).length == 0) ||
             (pcVar28 = strchr((meshSrc_00->mShader).data,0x2e), pcVar28 != (char *)0x0)) {
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,&meshSrc_00->mShader,"$tex.file",1,0);
          }
          else {
            aiString::aiString((aiString *)local_b04,&meshSrc_00->mShader);
            aiString::Append((aiString *)local_b04,"_local.tga");
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,(aiString *)local_b04,"$tex.file",6,0);
            aiString::aiString(&local_f08,&meshSrc_00->mShader);
            aiString::operator=((aiString *)local_b04,&local_f08);
            aiString::Append((aiString *)local_b04,"_s.tga");
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,(aiString *)local_b04,"$tex.file",2,0);
            aiString::aiString(&local_130c,&meshSrc_00->mShader);
            aiString::operator=((aiString *)local_b04,&local_130c);
            aiString::Append((aiString *)local_b04,"_d.tga");
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,(aiString *)local_b04,"$tex.file",1,0);
            aiString::aiString(&local_1710,&meshSrc_00->mShader);
            aiString::operator=((aiString *)local_b04,&local_1710);
            aiString::Append((aiString *)local_b04,"_h.tga");
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,(aiString *)local_b04,"$tex.file",5,0);
            aiMaterial::AddProperty
                      ((aiMaterial *)temp.data._1016_8_,&meshSrc_00->mShader,"?mat.name",0,0);
          }
          *(uint *)(name.field_2._8_8_ + 0xe8) = (uint)it_1._M_current;
          std::__cxx11::string::~string((string *)local_188);
          it_1._M_current._0_4_ = (uint)it_1._M_current + 1;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::MD5::MeshDesc_*,_std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>_>
        ::operator++(&end_1);
      }
      MD5::MD5MeshParser::~MD5MeshParser((MD5MeshParser *)local_f0);
      MD5::MD5Parser::~MD5Parser
                ((MD5Parser *)
                 &meshParser.mJoints.
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_006d350f;
    }
  }
  pLVar21 = DefaultLogger::get();
  std::operator+(&local_90,"Failed to access MD5MESH file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
  Logger::warn(pLVar21,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
LAB_006d350f:
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_38);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void MD5Importer::LoadMD5MeshFile ()
{
    std::string pFile = mFile + "md5mesh";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL || !file->FileSize())    {
        ASSIMP_LOG_WARN("Failed to access MD5MESH file: " + pFile);
        return;
    }
    bHadMD5Mesh = true;
    LoadFileIntoMemory(file.get());

    // now construct a parser and parse the file
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the mesh information from it
    MD5::MD5MeshParser meshParser(parser.mSections);

    // create the bone hierarchy - first the root node and dummy nodes for all meshes
    pScene->mRootNode = new aiNode("<MD5_Root>");
    pScene->mRootNode->mNumChildren = 2;
    pScene->mRootNode->mChildren = new aiNode*[2];

    // build the hierarchy from the MD5MESH file
    aiNode* pcNode = pScene->mRootNode->mChildren[1] = new aiNode();
    pcNode->mName.Set("<MD5_Hierarchy>");
    pcNode->mParent = pScene->mRootNode;
    AttachChilds_Mesh(-1,pcNode,meshParser.mJoints);

    pcNode = pScene->mRootNode->mChildren[0] = new aiNode();
    pcNode->mName.Set("<MD5_Mesh>");
    pcNode->mParent = pScene->mRootNode;

#if 0
    if (pScene->mRootNode->mChildren[1]->mNumChildren) /* start at the right hierarchy level */
        SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[1]->mChildren[0]);
#else

    // FIX: MD5 files exported from Blender can have empty meshes
    for (std::vector<MD5::MeshDesc>::const_iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        if (!(*it).mFaces.empty() && !(*it).mVertices.empty())
            ++pScene->mNumMaterials;
    }

    // generate all meshes
    pScene->mNumMeshes = pScene->mNumMaterials;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    //  storage for node mesh indices
    pcNode->mNumMeshes = pScene->mNumMeshes;
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
    for (unsigned int m = 0; m < pcNode->mNumMeshes;++m)
        pcNode->mMeshes[m] = m;

    unsigned int n = 0;
    for (std::vector<MD5::MeshDesc>::iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        MD5::MeshDesc& meshSrc = *it;
        if (meshSrc.mFaces.empty() || meshSrc.mVertices.empty())
            continue;

        aiMesh* mesh = pScene->mMeshes[n] = new aiMesh();
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // generate unique vertices in our internal verbose format
        MakeDataUnique(meshSrc);

        std::string name( meshSrc.mShader.C_Str() );
        name += ".msh";
        mesh->mName = name;
        mesh->mNumVertices = (unsigned int) meshSrc.mVertices.size();
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
        mesh->mNumUVComponents[0] = 2;

        // copy texture coordinates
        aiVector3D* pv = mesh->mTextureCoords[0];
        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            pv->x = (*iter).mUV.x;
            pv->y = 1.0f-(*iter).mUV.y; // D3D to OpenGL
            pv->z = 0.0f;
        }

        // sort all bone weights - per bone
        unsigned int* piCount = new unsigned int[meshParser.mJoints.size()];
        ::memset(piCount,0,sizeof(unsigned int)*meshParser.mJoints.size());

        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
            {
                MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                /* FIX for some invalid exporters */
                if (!(weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON ))
                    ++piCount[weightDesc.mBone];
            }
        }

        // check how many we will need
        for (unsigned int p = 0; p < meshParser.mJoints.size();++p)
            if (piCount[p])mesh->mNumBones++;

        if (mesh->mNumBones) // just for safety
        {
            mesh->mBones = new aiBone*[mesh->mNumBones];
            for (unsigned int q = 0,h = 0; q < meshParser.mJoints.size();++q)
            {
                if (!piCount[q])continue;
                aiBone* p = mesh->mBones[h] = new aiBone();
                p->mNumWeights = piCount[q];
                p->mWeights = new aiVertexWeight[p->mNumWeights];
                p->mName = aiString(meshParser.mJoints[q].mName);
                p->mOffsetMatrix = meshParser.mJoints[q].mInvTransform;

                // store the index for later use
                MD5::BoneDesc& boneSrc = meshParser.mJoints[q];
                boneSrc.mMap = h++;

                // compute w-component of quaternion
                MD5::ConvertQuaternion( boneSrc.mRotationQuat, boneSrc.mRotationQuatConverted );
            }

            pv = mesh->mVertices;
            for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
                // compute the final vertex position from all single weights
                *pv = aiVector3D();

                // there are models which have weights which don't sum to 1 ...
                ai_real fSum = 0.0;
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
                    fSum += meshSrc.mWeights[w].mWeight;
                if (!fSum) {
                    ASSIMP_LOG_ERROR("MD5MESH: The sum of all vertex bone weights is 0");
                    continue;
                }

                // process bone weights
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)   {
                    if (w >= meshSrc.mWeights.size())
                        throw DeadlyImportError("MD5MESH: Invalid weight index");

                    MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                    if ( weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON) {
                        continue;
                    }

                    const ai_real fNewWeight = weightDesc.mWeight / fSum;

                    // transform the local position into worldspace
                    MD5::BoneDesc& boneSrc = meshParser.mJoints[weightDesc.mBone];
                    const aiVector3D v = boneSrc.mRotationQuatConverted.Rotate (weightDesc.vOffsetPosition);

                    // use the original weight to compute the vertex position
                    // (some MD5s seem to depend on the invalid weight values ...)
                    *pv += ((boneSrc.mPositionXYZ+v)* (ai_real)weightDesc.mWeight);

                    aiBone* bone = mesh->mBones[boneSrc.mMap];
                    *bone->mWeights++ = aiVertexWeight((unsigned int)(pv-mesh->mVertices),fNewWeight);
                }
            }

            // undo our nice offset tricks ...
            for (unsigned int p = 0; p < mesh->mNumBones;++p) {
                mesh->mBones[p]->mWeights -= mesh->mBones[p]->mNumWeights;
            }
        }

        delete[] piCount;

        // now setup all faces - we can directly copy the list
        // (however, take care that the aiFace destructor doesn't delete the mIndices array)
        mesh->mNumFaces = (unsigned int)meshSrc.mFaces.size();
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int c = 0; c < mesh->mNumFaces;++c)   {
            mesh->mFaces[c].mNumIndices = 3;
            mesh->mFaces[c].mIndices = meshSrc.mFaces[c].mIndices;
            meshSrc.mFaces[c].mIndices = NULL;
        }

        // generate a material for the mesh
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[n] = mat;

        // insert the typical doom3 textures:
        // nnn_local.tga  - normal map
        // nnn_h.tga      - height map
        // nnn_s.tga      - specular map
        // nnn_d.tga      - diffuse map
        if (meshSrc.mShader.length && !strchr(meshSrc.mShader.data,'.')) {

            aiString temp(meshSrc.mShader);
            temp.Append("_local.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_NORMALS(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_s.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_SPECULAR(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_d.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_DIFFUSE(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_h.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_HEIGHT(0));

            // set this also as material name
            mat->AddProperty(&meshSrc.mShader,AI_MATKEY_NAME);
        }
        else {
            mat->AddProperty(&meshSrc.mShader, AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        mesh->mMaterialIndex = n++;
    }
#endif
}